

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O1

upb_FileDef * upb_DefPool_FindFileContainingSymbol(upb_DefPool *s,char *name)

{
  _Bool _Var1;
  upb_deftype_t uVar2;
  uint64_t in_RAX;
  size_t sVar3;
  upb_FieldDef *f;
  char *pcVar4;
  upb_MessageDef *puVar5;
  undefined7 extraout_var;
  upb_FileDef *puVar6;
  upb_ServiceDef *s_00;
  upb_EnumValueDef *v_00;
  upb_EnumDef *e;
  bool bVar7;
  upb_value v;
  upb_value local_28;
  
  local_28.val = in_RAX;
  sVar3 = strlen(name);
  _Var1 = upb_strtable_lookup2(&s->syms,name,sVar3,&local_28);
  if (!_Var1) {
    pcVar4 = strrchr(name,0x2e);
    if (pcVar4 != (char *)0x0) {
      puVar5 = (upb_MessageDef *)
               _upb_DefPool_Unpack(s,name,(long)pcVar4 - (long)name,UPB_DEFTYPE_MSG);
      if (puVar5 == (upb_MessageDef *)0x0) {
        bVar7 = true;
        puVar6 = (upb_FileDef *)0x0;
      }
      else {
        sVar3 = strlen(pcVar4 + 1);
        _Var1 = upb_MessageDef_FindByNameWithSize
                          (puVar5,pcVar4 + 1,sVar3,(upb_FieldDef **)0x0,(upb_OneofDef **)0x0);
        puVar6 = (upb_FileDef *)CONCAT71(extraout_var,_Var1);
        if (_Var1) {
          puVar6 = upb_MessageDef_File(puVar5);
        }
        bVar7 = !_Var1;
      }
      if (!bVar7) {
        return puVar6;
      }
    }
    return (upb_FileDef *)0x0;
  }
  uVar2 = _upb_DefType_Type(local_28);
  switch(uVar2) {
  case UPB_DEFTYPE_EXT:
    f = (upb_FieldDef *)_upb_DefType_Unpack(local_28,UPB_DEFTYPE_EXT);
    puVar6 = upb_FieldDef_File(f);
    break;
  case UPB_DEFTYPE_MSG:
    puVar5 = (upb_MessageDef *)_upb_DefType_Unpack(local_28,UPB_DEFTYPE_MSG);
    puVar6 = upb_MessageDef_File(puVar5);
    break;
  case UPB_DEFTYPE_ENUM:
    e = (upb_EnumDef *)_upb_DefType_Unpack(local_28,UPB_DEFTYPE_ENUM);
    goto LAB_001175b3;
  case UPB_DEFTYPE_ENUMVAL:
    v_00 = (upb_EnumValueDef *)_upb_DefType_Unpack(local_28,UPB_DEFTYPE_ENUMVAL);
    e = upb_EnumValueDef_Enum(v_00);
LAB_001175b3:
    puVar6 = upb_EnumDef_File(e);
    break;
  case UPB_DEFTYPE_SERVICE:
    s_00 = (upb_ServiceDef *)_upb_DefType_Unpack(local_28,UPB_DEFTYPE_SERVICE);
    puVar6 = upb_ServiceDef_File(s_00);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/def_pool.c"
                  ,0x126,
                  "const upb_FileDef *upb_DefPool_FindFileContainingSymbol(const upb_DefPool *, const char *)"
                 );
  }
  return puVar6;
}

Assistant:

const upb_FileDef* upb_DefPool_FindFileContainingSymbol(const upb_DefPool* s,
                                                        const char* name) {
  upb_value v;
  // TODO: non-extension fields and oneofs.
  if (upb_strtable_lookup(&s->syms, name, &v)) {
    switch (_upb_DefType_Type(v)) {
      case UPB_DEFTYPE_EXT: {
        const upb_FieldDef* f = _upb_DefType_Unpack(v, UPB_DEFTYPE_EXT);
        return upb_FieldDef_File(f);
      }
      case UPB_DEFTYPE_MSG: {
        const upb_MessageDef* m = _upb_DefType_Unpack(v, UPB_DEFTYPE_MSG);
        return upb_MessageDef_File(m);
      }
      case UPB_DEFTYPE_ENUM: {
        const upb_EnumDef* e = _upb_DefType_Unpack(v, UPB_DEFTYPE_ENUM);
        return upb_EnumDef_File(e);
      }
      case UPB_DEFTYPE_ENUMVAL: {
        const upb_EnumValueDef* ev =
            _upb_DefType_Unpack(v, UPB_DEFTYPE_ENUMVAL);
        return upb_EnumDef_File(upb_EnumValueDef_Enum(ev));
      }
      case UPB_DEFTYPE_SERVICE: {
        const upb_ServiceDef* service =
            _upb_DefType_Unpack(v, UPB_DEFTYPE_SERVICE);
        return upb_ServiceDef_File(service);
      }
      default:
        UPB_UNREACHABLE();
    }
  }

  const char* last_dot = strrchr(name, '.');
  if (last_dot) {
    const upb_MessageDef* parent =
        upb_DefPool_FindMessageByNameWithSize(s, name, last_dot - name);
    if (parent) {
      const char* shortname = last_dot + 1;
      if (upb_MessageDef_FindByNameWithSize(parent, shortname,
                                            strlen(shortname), NULL, NULL)) {
        return upb_MessageDef_File(parent);
      }
    }
  }

  return NULL;
}